

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

Fad<long_double> * __thiscall
TPZFMatrix<Fad<long_double>_>::GetVal(TPZFMatrix<Fad<long_double>_> *this,int64_t row,int64_t col)

{
  Fad<long_double> *in_RDX;
  Fad<long_double> *in_RSI;
  Fad<long_double> *in_RDI;
  
  Fad<long_double>::Fad(in_RSI,in_RDX);
  return in_RDI;
}

Assistant:

inline const TVar TPZFMatrix<TVar>::GetVal( const int64_t row, const int64_t col ) const {
    return( fElem[ col*this->fRow + row ] );
}